

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::CastFinder::CastFinder(CastFinder *this,PassOptions *options)

{
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  .replacep = (Expression **)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  .stack.usedFixed = 0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
           ).
           super_Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
           ).
           super_Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  .currFunction = (Function *)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  .currModule = (Module *)0x0;
  SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
  ::SmallSetBase(&(this->castTypes).
                  super_SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
                );
  this->trapsNeverHappen = options->trapsNeverHappen;
  return;
}

Assistant:

CastFinder(const PassOptions& options)
    : trapsNeverHappen(options.trapsNeverHappen) {}